

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

void __thiscall cmBoundsCheckerParser::ParseError(cmBoundsCheckerParser *this,char **atts)

{
  iterator iVar1;
  cmCTest *this_00;
  int iVar2;
  char *pcVar3;
  char *__s1;
  char **ppcVar4;
  int *__args;
  ostringstream cmCTestLog_msg;
  long *local_1b0;
  long local_1a0 [2];
  int local_190 [28];
  ios_base local_120 [264];
  
  pcVar3 = *atts;
  if (pcVar3 != (char *)0x0) {
    ppcVar4 = atts + 1;
    do {
      iVar2 = strcmp("ErrorCategory",pcVar3);
      if (iVar2 == 0) {
        pcVar3 = *ppcVar4;
        if (pcVar3 != (char *)0x0) {
          if (cmCTestMemCheckBoundsChecker[0].ErrorCategory == (char *)0x0) {
            return;
          }
          __args = &cmCTestMemCheckBoundsChecker[0].ErrorCode;
          __s1 = cmCTestMemCheckBoundsChecker[0].ErrorCategory;
          do {
            iVar2 = strcmp(__s1,pcVar3);
            if (iVar2 == 0) {
              iVar1._M_current =
                   (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar1._M_current !=
                  (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar1._M_current = *__args;
                (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                return;
              }
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->Errors,iVar1,__args);
              return;
            }
            __s1 = *(char **)(__args + 2);
            __args = __args + 4;
          } while (__s1 != (char *)0x0);
          return;
        }
        break;
      }
      pcVar3 = *ppcVar4;
      ppcVar4 = ppcVar4 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  local_190[0] = 1;
  iVar1._M_current =
       (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->Errors,iVar1,local_190);
  }
  else {
    *iVar1._M_current = 1;
    (this->Errors).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"No Category found in Bounds checker XML\n",0x28);
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x60,(char *)local_1b0,false);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void ParseError(const char** atts)
  {
    CatToErrorType* ptr = cmCTestMemCheckBoundsChecker;
    const char* cat = this->GetAttribute("ErrorCategory", atts);
    if (!cat) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No Category found in Bounds checker XML\n");
      return;
    }
    while (ptr->ErrorCategory && cat) {
      if (strcmp(ptr->ErrorCategory, cat) == 0) {
        this->Errors.push_back(ptr->ErrorCode);
        return; // found it we are done
      }
      ptr++;
    }
    if (ptr->ErrorCategory) {
      this->Errors.push_back(cmCTestMemCheckHandler::ABW); // do not know
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Found unknown Bounds Checker error " << ptr->ErrorCategory
                                                       << std::endl);
    }
  }